

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRViewportNode.cpp
# Opt level: O3

void __thiscall
MinVR::VRViewportNode::render
          (VRViewportNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_e8;
  VRRect local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  VRDataIndex::pushState(renderState);
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ViewportX","");
  VRDataIndex::addData(&local_48,renderState,&local_e8,(int)(this->_rect).m_xOffset);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ViewportY","");
  VRDataIndex::addData(&local_68,renderState,&local_e8,(int)(this->_rect).m_yOffset);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ViewportWidth","");
  VRDataIndex::addData(&local_88,renderState,&local_e8,(int)(this->_rect).m_width);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ViewportHeight","");
  VRDataIndex::addData(&local_a8,renderState,&local_e8,(int)(this->_rect).m_height);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_c8.super_VRWritable._vptr_VRWritable = (_func_int **)&PTR__VRRect_00177ce0;
  local_c8.m_xOffset = (this->_rect).m_xOffset;
  local_c8.m_yOffset = (this->_rect).m_yOffset;
  local_c8.m_width = (this->_rect).m_width;
  local_c8.m_height = (this->_rect).m_height;
  local_c8.m_usePercent = (this->_rect).m_usePercent;
  (**(code **)(*(long *)this->_gfxToolkit + 0x20))();
  VRRect::~VRRect(&local_c8);
  VRDisplayNode::render(&this->super_VRDisplayNode,renderState,renderHandler);
  VRDataIndex::popState(renderState);
  return;
}

Assistant:

void VRViewportNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler) {
  renderState->pushState();

	// Is this the kind of state information we expect to pass from one node to the next?
	renderState->addData("ViewportX", (int)_rect.getX());
	renderState->addData("ViewportY", (int)_rect.getY());
	renderState->addData("ViewportWidth", (int)_rect.getWidth());
	renderState->addData("ViewportHeight", (int)_rect.getHeight());
  
	_gfxToolkit->setSubWindow(_rect);

	VRDisplayNode::render(renderState, renderHandler);

    renderState->popState();
}